

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O2

int Abc_GraphBuildState(Vec_Int_t *vState,int e,int x,Vec_Int_t *vEdges,Vec_Int_t *vLife,
                       Vec_Wec_t *vFronts,int *pFront,Vec_Int_t *vStateNew,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int *piVar4;
  uint uVar5;
  int i;
  int iVar6;
  int First;
  long lVar7;
  int local_5c;
  int pEquivs [2];
  
  p = Vec_WecEntry(vFronts,e);
  p_00 = Vec_WecEntry(vFronts,e + 1);
  piVar4 = Vec_IntEntryP(vEdges,e * 2);
  local_5c = vLife->nSize / 2;
  if (piVar4[1] <= *piVar4) {
    __assert_fail("pNodes[0] < pNodes[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPath.c"
                  ,0x17b,
                  "int Abc_GraphBuildState(Vec_Int_t *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, int *, Vec_Int_t *, int)"
                 );
  }
  if (fVerbose != 0) {
    printf("Edge = %d. Arc = %d.\nCurrent state: ",(ulong)(uint)e,(ulong)(uint)x);
  }
  for (iVar6 = 0; iVar6 < p->nSize; iVar6 = iVar6 + 1) {
    iVar1 = Vec_IntEntry(p,iVar6);
    uVar2 = Vec_IntEntry(vState,iVar6);
    pFront[iVar1] = uVar2;
    if (fVerbose != 0) {
      printf("%d(%d) ",(ulong)(uVar2 & 0xffff),(ulong)(uint)((int)uVar2 >> 0x10));
    }
  }
  if (fVerbose != 0) {
    putchar(10);
  }
  for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
    iVar6 = Vec_IntEntry(vLife,piVar4[lVar7] * 2);
    if (iVar6 == e) {
      pFront[piVar4[lVar7]] = piVar4[lVar7];
    }
  }
  iVar6 = *piVar4;
  iVar1 = piVar4[1];
  if (x != 0) {
    if ((short)pFront[iVar1] == (short)pFront[iVar6]) {
      return -1;
    }
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      iVar6 = piVar4[lVar7];
      iVar1 = pFront[iVar6] >> 0x10;
      if (iVar6 == local_5c + -1 || iVar6 == 0) {
        if (0 < iVar1) {
          return -1;
        }
      }
      else if (1 < iVar1) {
        return -1;
      }
      pFront[iVar6] = pFront[iVar6] + 0x10000;
    }
    iVar6 = *piVar4;
    iVar1 = piVar4[1];
  }
  local_5c = local_5c + -1;
  pEquivs[0] = (int)*(ushort *)(pFront + iVar6);
  pEquivs[1] = (int)*(ushort *)(pFront + iVar1);
  lVar7 = 0;
  do {
    iVar1 = pEquivs[1];
    iVar6 = pEquivs[0];
    if (lVar7 == 2) {
      if (x != 0) {
        uVar2 = 0xffffffff;
        for (i = 0; i < p_00->nSize; i = i + 1) {
          uVar3 = Vec_IntEntry(p_00,i);
          uVar5 = pFront[(int)uVar3] & 0xffff;
          if ((uVar5 == iVar6) || (uVar5 == iVar1)) {
            if (uVar2 == 0xffffffff) {
              uVar2 = uVar3;
            }
            pFront[(int)uVar3] = pFront[(int)uVar3] & 0xffff0000U | uVar2;
          }
        }
      }
      vStateNew->nSize = 0;
      if (fVerbose != 0) {
        printf("Next state: ");
      }
      for (iVar6 = 0; iVar6 < p_00->nSize; iVar6 = iVar6 + 1) {
        iVar1 = Vec_IntEntry(p_00,iVar6);
        Vec_IntPush(vStateNew,pFront[iVar1]);
        if (fVerbose != 0) {
          printf("%d(%d) ",(ulong)(pFront[iVar1] & 0xffff),(ulong)(uint)(pFront[iVar1] >> 0x10));
        }
      }
      if (fVerbose != 0) {
        puts("\n");
      }
      return 1;
    }
    iVar6 = Vec_IntEntry(vLife,piVar4[lVar7] * 2 + 1);
    if (iVar6 == e) {
      iVar6 = piVar4[lVar7];
      iVar1 = pFront[iVar6] >> 0x10;
      if (((long)iVar6 == 0) || (iVar6 == local_5c)) {
        if (iVar1 != 1) {
          return -1;
        }
      }
      else if (0xffff < (uint)pFront[iVar6] && iVar1 != 2) {
        return -1;
      }
      uVar2 = 0xffffffff;
      for (iVar6 = 0; iVar6 < p_00->nSize; iVar6 = iVar6 + 1) {
        uVar3 = Vec_IntEntry(p_00,iVar6);
        if (uVar3 == piVar4[lVar7]) {
          __assert_fail("Node != pNodes[n]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPath.c"
                        ,0x1a0,
                        "int Abc_GraphBuildState(Vec_Int_t *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, int *, Vec_Int_t *, int)"
                       );
        }
        if ((pFront[(int)uVar3] & 0xffffU) == pEquivs[lVar7]) {
          if (uVar2 == 0xffffffff) {
            uVar2 = uVar3;
          }
          pFront[(int)uVar3] = pFront[(int)uVar3] & 0xffff0000U | uVar2;
        }
      }
      if (uVar2 != 0xffffffff) {
        pEquivs[lVar7] = uVar2;
      }
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

int Abc_GraphBuildState( Vec_Int_t * vState, int e, int x, Vec_Int_t * vEdges, Vec_Int_t * vLife, Vec_Wec_t * vFronts, int * pFront, Vec_Int_t * vStateNew, int fVerbose )
{
    Vec_Int_t * vFront = Vec_WecEntry( vFronts, e );
    Vec_Int_t * vFront2 = Vec_WecEntry( vFronts, e+1 );
    int * pNodes = Vec_IntEntryP(vEdges, 2*e);
    int nNodes = Vec_IntSize(vLife)/2;
    int i, n, Node, First, pEquivs[2];
    assert( pNodes[0] < pNodes[1] );
    if ( fVerbose ) printf( "Edge = %d. Arc = %d.\nCurrent state: ", e, x );
    Vec_IntForEachEntry( vFront, Node, i )
    {
        pFront[Node] = Vec_IntEntry(vState, i);
        if ( fVerbose ) printf( "%d(%d) ", pFront[Node] & 0xFFFF, pFront[Node] >> 16 );
    }
    if ( fVerbose ) printf( "\n" );
    for ( n = 0; n < 2; n++ )
        if ( Vec_IntEntry(vLife, 2*pNodes[n]) == e ) // first time
            pFront[pNodes[n]] = pNodes[n]; // degree = 0; comp = singleton
    if ( x )
    {
        if ( (pFront[pNodes[0]] & 0xFFFF) == (pFront[pNodes[1]] & 0xFFFF) ) // the same comp
            return -1; // const 0
        for ( n = 0; n < 2; n++ )
        {
            int Degree = pFront[pNodes[n]] >> 16;
            if ( (pNodes[n] == 0 || pNodes[n] == nNodes-1) ? Degree >= 1 : Degree >= 2 )
                return -1; // const 0
            pFront[pNodes[n]] += (1 << 16); // degree++
        }
    }
    // remember equivalence classes
    pEquivs[0] = pFront[pNodes[0]] & 0xFFFF;
    pEquivs[1] = pFront[pNodes[1]] & 0xFFFF;
    // remove some nodes from the frontier
    for ( n = 0; n < 2; n++ )
        if ( Vec_IntEntry(vLife, 2*pNodes[n]+1) == e ) // last time
        {
            int Degree = pFront[pNodes[n]] >> 16;
            if ( (pNodes[n] == 0 || pNodes[n] == nNodes-1) ? Degree != 1 : Degree != 0 && Degree != 2 )
                return -1; // const 0
            // if it is part of the comp, update
            First = -1;
            Vec_IntForEachEntry( vFront2, Node, i )
            {
                assert( Node != pNodes[n] );
                if ( (pFront[Node] & 0xFFFF) == pEquivs[n] )
                {
                    if ( First == -1 )
                        First = Node;
                    pFront[Node] = (pFront[Node] & 0xFFFF0000) | First;
                }
            }
            if ( First != -1 )
                pEquivs[n] = First;
        }
    if ( x )
    {
        // union comp
        int First = -1;
        Vec_IntForEachEntry( vFront2, Node, i )
            if ( (pFront[Node] & 0xFFFF) == pEquivs[0] || (pFront[Node] & 0xFFFF) == pEquivs[1] )
            {
                if ( First == -1 )
                    First = Node;
                pFront[Node] = (pFront[Node] & 0xFFFF0000) | First;
            }
    }
    // create next state
    Vec_IntClear( vStateNew );
    if ( fVerbose ) printf( "Next state: " );
    Vec_IntForEachEntry( vFront2, Node, i )
    {
        Vec_IntPush( vStateNew, pFront[Node] );
        if ( fVerbose ) printf( "%d(%d) ", pFront[Node] & 0xFFFF, pFront[Node] >> 16 );
    }
    if ( fVerbose ) printf( "\n\n" );
    return 1;
}